

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

HashBuilder * __thiscall soul::HashBuilder::operator<<(HashBuilder *this,char c)

{
  uint8_t n;
  char c_local;
  HashBuilder *this_local;
  
  this->data[this->index + (uint)(byte)c & 0xff] =
       this->data[this->index + (uint)(byte)c & 0xff] * 7 ^ (uint)(byte)c;
  this->index = this->index + 1;
  this->data[this->index & 0xff] =
       this->data[this->index & 0xff] * 0x1f + (uint)(byte)c + this->index % 0x1ff;
  this->index = this->index + 1;
  this->data[this->index & 0xff] = this->data[this->index & 0xff] * 0x89 - (uint)(byte)c;
  this->index = this->index + 1;
  return this;
}

Assistant:

HashBuilder& HashBuilder::operator<< (char c) noexcept
{
    auto n = (uint8_t) c;
    data[(index + n) & 255] = (data[(index + n) & 255] * 7) ^ n;
    ++index;
    data[index & 255] = (data[index & 255] * 31) + n + (index % 511);
    ++index;
    data[index & 255] = (data[index & 255] * 137) - n;
    ++index;

    return *this;
}